

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O3

HanabiMove __thiscall hanabi_learning_env::HanabiGame::ConstructMove(HanabiGame *this,int uid)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar5 = 0xff00000000000000;
  uVar11 = 0xff000000000000;
  uVar10 = 0xff;
  bVar3 = 0xff;
  if (uid < 0) {
    uVar9 = 0;
    uid = uVar10;
    bVar3 = 0xff;
  }
  else {
    iVar4 = this->hand_size_;
    iVar7 = this->num_players_ + -1;
    iVar1 = this->num_colors_;
    iVar2 = this->num_ranks_;
    if (uid < (iVar2 + iVar1) * iVar7 + iVar4 * 2) {
      uVar9 = 2;
      uVar8 = uid - iVar4;
      if (iVar4 <= uid) {
        uVar9 = 1;
        iVar6 = uVar8 - iVar4;
        uid = uVar8;
        if (iVar4 <= (int)uVar8) {
          iVar7 = iVar7 * iVar1;
          iVar4 = iVar6 - iVar7;
          if (iVar6 < iVar7) {
            bVar3 = (char)(iVar6 / iVar1) + 1;
            uVar11 = ((long)iVar6 % (long)iVar1 & 0xffU) << 0x30;
            uVar9 = 3;
            uid = uVar10;
          }
          else {
            bVar3 = (char)(iVar4 / iVar2) + 1;
            uVar5 = (long)iVar4 % (long)iVar2 << 0x38;
            uVar9 = 4;
            uid = uVar10;
          }
        }
      }
    }
    else {
      uVar9 = 0;
      uid = uVar10;
    }
  }
  return (HanabiMove)((ulong)(uid & 0xff) << 0x20 | (ulong)bVar3 << 0x28 | uVar5 | uVar11 | uVar9);
}

Assistant:

HanabiMove HanabiGame::ConstructMove(int uid) const {
  if (uid < 0 || uid >= MaxMoves()) {
    return HanabiMove(HanabiMove::kInvalid, /*card_index=*/-1,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  if (uid < MaxDiscardMoves()) {
    return HanabiMove(HanabiMove::kDiscard, /*card_index=*/uid,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  uid -= MaxDiscardMoves();
  if (uid < MaxPlayMoves()) {
    return HanabiMove(HanabiMove::kPlay, /*card_index=*/uid,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  uid -= MaxPlayMoves();
  if (uid < MaxRevealColorMoves()) {
    return HanabiMove(HanabiMove::kRevealColor, /*card_index=*/-1,
                      /*target_offset=*/1 + uid / NumColors(),
                      /*color=*/uid % NumColors(), /*rank=*/-1);
  }
  uid -= MaxRevealColorMoves();
  return HanabiMove(HanabiMove::kRevealRank, /*card_index=*/-1,
                    /*target_offset=*/1 + uid / NumRanks(),
                    /*color=*/-1, /*rank=*/uid % NumRanks());
}